

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_tree.cpp
# Opt level: O1

void __thiscall
HuffTree::HuffTree(HuffTree *this,
                  unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
                  *data)

{
  int *piVar1;
  int *piVar2;
  TreeNode *pTVar3;
  TreeNode *pTVar4;
  default_delete<HuffTree::TreeNode> *this_00;
  pointer __p;
  undefined8 *puVar5;
  pointer __p_1;
  _Hash_node_base *p_Var6;
  ulong uVar7;
  unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> l;
  unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> r;
  TreeNode *local_d0;
  undefined1 local_c8 [8];
  TreeNode *pTStack_c0;
  TreeNode *local_b8;
  undefined1 local_b0;
  TreeNode *local_a0;
  TreeNode *local_98;
  TreeNode *local_90;
  TreeNode *local_88;
  TreeNode *local_80;
  TreeNode *local_78;
  TreeNode *local_70;
  TreeNode *local_68;
  default_delete<HuffTree::TreeNode> *local_60;
  unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
  *local_58;
  priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_jeinygroove[P]Huffman_Archiver_src_huffman_tree_cpp:14:17)>
  local_50;
  
  this->curr_node = (TreeNode *)0x0;
  (this->root)._M_t.
  super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
  super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
  super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl = (TreeNode *)0x0;
  local_60 = (default_delete<HuffTree::TreeNode> *)&this->root;
  local_50.c.
  super__Vector_base<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.c.
  super__Vector_base<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.c.
  super__Vector_base<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8 = (TreeNode *)0x0;
  local_c8 = (undefined1  [8])0x0;
  pTStack_c0 = (TreeNode *)0x0;
  std::
  vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
  ::~vector((vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
             *)local_c8);
  p_Var6 = (data->_M_h)._M_before_begin._M_nxt;
  local_58 = data;
  if (p_Var6 != (_Hash_node_base *)0x0) {
    do {
      local_68 = (TreeNode *)0x0;
      local_70 = (TreeNode *)0x0;
      local_c8[0] = *(undefined1 *)&p_Var6[1]._M_nxt;
      local_c8._4_4_ = *(undefined4 *)((long)&p_Var6[1]._M_nxt + 4);
      pTStack_c0 = (TreeNode *)0x0;
      local_b8 = (TreeNode *)0x0;
      local_b0 = 1;
      local_d0 = (TreeNode *)operator_new(0x20);
      local_d0->_data = local_c8[0];
      *(undefined3 *)&local_d0->field_0x1 = local_c8._1_3_;
      local_d0->_freq = local_c8._4_4_;
      (local_d0->_left)._M_t.
      super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
      super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
      super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl = (TreeNode *)0x0;
      pTStack_c0 = (TreeNode *)0x0;
      (local_d0->_right)._M_t.
      super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
      super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
      super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl = (TreeNode *)0x0;
      local_b8 = (TreeNode *)0x0;
      local_d0->_is_leaf = true;
      std::
      priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jeinygroove[P]Huffman-Archiver/src/huffman_tree.cpp:14:17)>
      ::push(&local_50,(value_type *)&local_d0);
      if (local_d0 != (TreeNode *)0x0) {
        std::default_delete<HuffTree::TreeNode>::operator()
                  ((default_delete<HuffTree::TreeNode> *)&local_d0,local_d0);
      }
      local_d0 = (TreeNode *)0x0;
      if (local_b8 != (TreeNode *)0x0) {
        std::default_delete<HuffTree::TreeNode>::operator()
                  ((default_delete<HuffTree::TreeNode> *)&local_b8,local_b8);
      }
      local_b8 = (TreeNode *)0x0;
      if (pTStack_c0 != (TreeNode *)0x0) {
        std::default_delete<HuffTree::TreeNode>::operator()
                  ((default_delete<HuffTree::TreeNode> *)&pTStack_c0,pTStack_c0);
      }
      pTStack_c0 = (TreeNode *)0x0;
      if (local_70 != (TreeNode *)0x0) {
        std::default_delete<HuffTree::TreeNode>::operator()
                  ((default_delete<HuffTree::TreeNode> *)&local_70,local_70);
      }
      local_70 = (TreeNode *)0x0;
      if (local_68 != (TreeNode *)0x0) {
        std::default_delete<HuffTree::TreeNode>::operator()
                  ((default_delete<HuffTree::TreeNode> *)&local_68,local_68);
      }
      local_68 = (TreeNode *)0x0;
      p_Var6 = p_Var6->_M_nxt;
    } while (p_Var6 != (_Hash_node_base *)0x0);
  }
  uVar7 = (local_58->_M_h)._M_element_count;
  if (1 < uVar7) {
    do {
      local_d0 = ((local_50.c.
                   super__Vector_base<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                 super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>
                 .super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl;
      ((local_50.c.
        super__Vector_base<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
      super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
      super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
      super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl = (TreeNode *)0x0;
      std::
      priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jeinygroove[P]Huffman-Archiver/src/huffman_tree.cpp:14:17)>
      ::pop(&local_50);
      local_a0 = ((local_50.c.
                   super__Vector_base<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                 super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>
                 .super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl;
      ((local_50.c.
        super__Vector_base<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
      super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
      super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
      super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl = (TreeNode *)0x0;
      std::
      priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jeinygroove[P]Huffman-Archiver/src/huffman_tree.cpp:14:17)>
      ::pop(&local_50);
      pTVar4 = local_a0;
      pTVar3 = local_d0;
      piVar1 = &local_a0->_freq;
      piVar2 = &local_d0->_freq;
      local_d0 = (TreeNode *)0x0;
      local_a0 = (TreeNode *)0x0;
      local_c8[0] = 0x20;
      local_c8._4_4_ = *piVar1 + *piVar2;
      pTStack_c0 = pTVar3;
      local_80 = (TreeNode *)0x0;
      local_b8 = pTVar4;
      local_88 = (TreeNode *)0x0;
      local_b0 = 0;
      local_78 = (TreeNode *)operator_new(0x20);
      local_78->_data = local_c8[0];
      *(undefined3 *)&local_78->field_0x1 = local_c8._1_3_;
      local_78->_freq = local_c8._4_4_;
      (local_78->_left)._M_t.
      super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
      super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
      super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl = pTVar3;
      pTStack_c0 = (TreeNode *)0x0;
      (local_78->_right)._M_t.
      super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
      super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
      super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl = pTVar4;
      local_b8 = (TreeNode *)0x0;
      local_78->_is_leaf = false;
      std::
      priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jeinygroove[P]Huffman-Archiver/src/huffman_tree.cpp:14:17)>
      ::push(&local_50,(value_type *)&local_78);
      if (local_78 != (TreeNode *)0x0) {
        std::default_delete<HuffTree::TreeNode>::operator()
                  ((default_delete<HuffTree::TreeNode> *)&local_78,local_78);
      }
      local_78 = (TreeNode *)0x0;
      if (local_b8 != (TreeNode *)0x0) {
        std::default_delete<HuffTree::TreeNode>::operator()
                  ((default_delete<HuffTree::TreeNode> *)&local_b8,local_b8);
      }
      local_b8 = (TreeNode *)0x0;
      if (pTStack_c0 != (TreeNode *)0x0) {
        std::default_delete<HuffTree::TreeNode>::operator()
                  ((default_delete<HuffTree::TreeNode> *)&pTStack_c0,pTStack_c0);
      }
      pTStack_c0 = (TreeNode *)0x0;
      if (local_88 != (TreeNode *)0x0) {
        std::default_delete<HuffTree::TreeNode>::operator()
                  ((default_delete<HuffTree::TreeNode> *)&local_88,local_88);
      }
      local_88 = (TreeNode *)0x0;
      if (local_80 != (TreeNode *)0x0) {
        std::default_delete<HuffTree::TreeNode>::operator()
                  ((default_delete<HuffTree::TreeNode> *)&local_80,local_80);
      }
      local_80 = (TreeNode *)0x0;
      if (local_a0 != (TreeNode *)0x0) {
        std::default_delete<HuffTree::TreeNode>::operator()
                  ((default_delete<HuffTree::TreeNode> *)&local_a0,local_a0);
      }
      if (local_d0 != (TreeNode *)0x0) {
        std::default_delete<HuffTree::TreeNode>::operator()
                  ((default_delete<HuffTree::TreeNode> *)&local_d0,local_d0);
      }
      uVar7 = uVar7 - 1;
    } while (1 < uVar7);
  }
  if (local_50.c.
      super__Vector_base<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_50.c.
      super__Vector_base<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_d0 = ((local_50.c.
                 super__Vector_base<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>.
               _M_t.
               super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>
               .super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl;
    ((local_50.c.
      super__Vector_base<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->_M_t).
    super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
    super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
    super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl = (TreeNode *)0x0;
    std::
    priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jeinygroove[P]Huffman-Archiver/src/huffman_tree.cpp:14:17)>
    ::pop(&local_50);
    this_00 = local_60;
    pTVar3 = local_d0;
    if ((local_58->_M_h)._M_element_count == 1) {
      piVar1 = &local_d0->_freq;
      local_d0 = (TreeNode *)0x0;
      local_98 = (TreeNode *)0x0;
      local_c8[0] = 0x20;
      local_c8._4_4_ = *piVar1;
      pTStack_c0 = pTVar3;
      local_90 = (TreeNode *)0x0;
      local_b8 = (TreeNode *)0x0;
      local_b0 = 0;
      puVar5 = (undefined8 *)operator_new(0x20);
      *puVar5 = local_c8;
      puVar5[1] = pTVar3;
      pTStack_c0 = (TreeNode *)0x0;
      puVar5[2] = 0;
      local_b8 = (TreeNode *)0x0;
      *(undefined1 *)(puVar5 + 3) = 0;
      local_a0 = (TreeNode *)0x0;
      pTVar3 = *(TreeNode **)this_00;
      *(undefined8 **)this_00 = puVar5;
      if (pTVar3 != (TreeNode *)0x0) {
        std::default_delete<HuffTree::TreeNode>::operator()(this_00,pTVar3);
      }
      if (local_a0 != (TreeNode *)0x0) {
        std::default_delete<HuffTree::TreeNode>::operator()
                  ((default_delete<HuffTree::TreeNode> *)&local_a0,local_a0);
      }
      local_a0 = (TreeNode *)0x0;
      if (local_b8 != (TreeNode *)0x0) {
        std::default_delete<HuffTree::TreeNode>::operator()
                  ((default_delete<HuffTree::TreeNode> *)&local_b8,local_b8);
      }
      local_b8 = (TreeNode *)0x0;
      if (pTStack_c0 != (TreeNode *)0x0) {
        std::default_delete<HuffTree::TreeNode>::operator()
                  ((default_delete<HuffTree::TreeNode> *)&pTStack_c0,pTStack_c0);
      }
      pTStack_c0 = (TreeNode *)0x0;
      if (local_98 != (TreeNode *)0x0) {
        std::default_delete<HuffTree::TreeNode>::operator()
                  ((default_delete<HuffTree::TreeNode> *)&local_98,local_98);
      }
      local_98 = (TreeNode *)0x0;
      if (local_90 != (TreeNode *)0x0) {
        std::default_delete<HuffTree::TreeNode>::operator()
                  ((default_delete<HuffTree::TreeNode> *)&local_90,local_90);
      }
      local_90 = (TreeNode *)0x0;
    }
    else {
      local_d0 = (TreeNode *)0x0;
      pTVar4 = *(TreeNode **)local_60;
      *(TreeNode **)local_60 = pTVar3;
      if (pTVar4 != (TreeNode *)0x0) {
        std::default_delete<HuffTree::TreeNode>::operator()(local_60,pTVar4);
      }
    }
    if (local_d0 != (TreeNode *)0x0) {
      std::default_delete<HuffTree::TreeNode>::operator()
                ((default_delete<HuffTree::TreeNode> *)&local_d0,local_d0);
    }
  }
  std::
  vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
  ::~vector(&local_50.c);
  return;
}

Assistant:

HuffTree::HuffTree(const std::unordered_map<char, int> &data) {
    auto comp = [](const std::unique_ptr<TreeNode> &l, const std::unique_ptr<TreeNode> &r) -> bool {
        return (l->_freq > r->_freq);
    };

    std::priority_queue<std::unique_ptr<TreeNode>,
            std::vector<std::unique_ptr<TreeNode>>,
            decltype(comp)> MinHeap(comp);

    for (auto i : data) {
        MinHeap.push(std::make_unique<TreeNode>(TreeNode(i.first, i.second, nullptr, nullptr, true)));
    }
    std::size_t size = data.size();
    while (size > 1) {
        std::unique_ptr<TreeNode> l(std::move(const_cast<std::unique_ptr<TreeNode> &>(MinHeap.top())));
        MinHeap.pop();

        std::unique_ptr<TreeNode> r(std::move(const_cast<std::unique_ptr<TreeNode> &>(MinHeap.top())));
        MinHeap.pop();

        int freq = l->_freq + r->_freq;
        MinHeap.push(std::make_unique<TreeNode>(TreeNode(' ', freq, std::move(l), std::move(r), false)));
        size--;
    }
    if (!MinHeap.empty()) {
        std::unique_ptr<TreeNode> top(std::move(const_cast<std::unique_ptr<TreeNode> &>(MinHeap.top())));
        MinHeap.pop();
        if (data.size() == 1) {
            int freq = top->_freq;
            root = std::make_unique<TreeNode>(TreeNode(' ', freq, std::move(top),
                                                       nullptr, false));
        } else {
            root = std::move(const_cast<std::unique_ptr<TreeNode> &>(top));
        }
    }
}